

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_SetShapeBlendMode(GPU_BlendPresetEnum preset)

{
  undefined4 source_color;
  undefined1 auVar1 [8];
  undefined4 dest_color;
  GPU_BlendFuncEnum source_alpha;
  undefined8 uVar2;
  GPU_BlendFuncEnum dest_alpha;
  undefined1 local_3c [24];
  undefined1 local_24 [8];
  GPU_BlendMode b;
  GPU_BlendPresetEnum preset_local;
  
  if ((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
     (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) {
    b.color_equation = preset;
    GPU_GetBlendModeFromPreset((GPU_BlendMode *)local_3c,preset);
    local_24 = (undefined1  [8])local_3c._0_8_;
    auVar1 = local_24;
    b.source_color = local_3c._8_4_;
    b.dest_color = local_3c._12_4_;
    uVar2 = b._0_8_;
    b.source_alpha = local_3c._16_4_;
    b.dest_alpha = local_3c._20_4_;
    local_24._0_4_ = (undefined4)local_3c._0_8_;
    source_color = local_24._0_4_;
    local_24._4_4_ = SUB84(local_3c._0_8_,4);
    dest_color = local_24._4_4_;
    b.source_color = (GPU_BlendFuncEnum)local_3c._8_8_;
    source_alpha = b.source_color;
    b.dest_color = SUB84(local_3c._8_8_,4);
    dest_alpha = b.dest_color;
    local_24 = auVar1;
    b._0_8_ = uVar2;
    GPU_SetShapeBlendFunction(source_color,dest_color,source_alpha,dest_alpha);
    GPU_SetShapeBlendEquation(b.source_alpha,b.dest_alpha);
  }
  return;
}

Assistant:

void GPU_SetShapeBlendMode(GPU_BlendPresetEnum preset)
{
    GPU_BlendMode b;
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return;

    b = GPU_GetBlendModeFromPreset(preset);
    GPU_SetShapeBlendFunction(b.source_color, b.dest_color, b.source_alpha, b.dest_alpha);
    GPU_SetShapeBlendEquation(b.color_equation, b.alpha_equation);
}